

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O1

void __thiscall cov::error::~error(error *this)

{
  ~error(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~error() override = default;